

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

void __thiscall
TimerManager::addTimer(TimerManager *this,shared_ptr<HttpData> *SPHttpData,int timeout)

{
  element_type *peVar1;
  TimerNode *this_00;
  __shared_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2> local_50;
  undefined1 local_40 [8];
  SPTimerNode new_node;
  
  this_00 = (TimerNode *)operator_new(0x20);
  std::__shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,&SPHttpData->super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>);
  TimerNode::TimerNode(this_00,(shared_ptr<HttpData> *)&local_50,timeout);
  std::__shared_ptr<TimerNode,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<TimerNode,void>
            ((__shared_ptr<TimerNode,(__gnu_cxx::_Lock_policy)2> *)local_40,this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  std::
  priority_queue<std::shared_ptr<TimerNode>,_std::deque<std::shared_ptr<TimerNode>,_std::allocator<std::shared_ptr<TimerNode>_>_>,_TimerCmp>
  ::push(&this->timerNodeQueue,(value_type *)local_40);
  peVar1 = (SPHttpData->super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,(__shared_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2> *)local_40);
  std::__weak_ptr<TimerNode,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_ptr<TimerNode,(__gnu_cxx::_Lock_policy)2> *)&peVar1->timer_,&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&new_node);
  return;
}

Assistant:

void TimerManager::addTimer(std::shared_ptr<HttpData> SPHttpData, int timeout) {
  SPTimerNode new_node(new TimerNode(SPHttpData, timeout));
  timerNodeQueue.push(new_node);
  SPHttpData->linkTimer(new_node);
}